

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-dt-erector.cpp
# Opt level: O0

Up __thiscall
yactfr::internal::PseudoDtErector::_pseudoDtFromOptType
          (PseudoDtErector *this,JsonObjVal *jsonDt,Up *attrs)

{
  JsonVal *pJVar1;
  JsonArrayVal *jsonSelFieldRanges_00;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *in_RCX;
  anon_class_16_2_44452b93 func;
  unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_> local_110
  ;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_108;
  undefined4 local_fc;
  unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_> local_f8;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_f0;
  allocator local_e1;
  string local_e0;
  JsonVal *local_c0;
  JsonVal *jsonSelFieldRanges;
  Up *local_b0;
  undefined1 local_a8 [8];
  type pseudoDt;
  string local_88;
  undefined1 local_68 [8];
  PseudoDataLoc pseudoSelLoc;
  Up *attrs_local;
  JsonObjVal *jsonDt_local;
  PseudoDtErector *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_88,"selector-field-location",(allocator *)&stack0xffffffffffffff77);
  anon_unknown_2::pseudoDataLocOfDynDt((PseudoDataLoc *)local_68,(JsonObjVal *)attrs,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  func.jsonDt = jsonDt;
  func.this = (PseudoDtErector *)local_a8;
  jsonSelFieldRanges = &jsonDt->super_JsonVal;
  local_b0 = attrs;
  call<yactfr::internal::PseudoDtErector::_pseudoDtFromOptType(yactfr::internal::JsonObjVal_const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>)::__0>
            (func);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"selector-field-ranges",&local_e1);
  pJVar1 = JsonObjVal::operator[]((JsonObjVal *)attrs,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  local_c0 = pJVar1;
  if (pJVar1 == (JsonVal *)0x0) {
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::unique_ptr
              (&local_108,in_RCX);
    std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>::
    unique_ptr(&local_110,
               (unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
                *)local_a8);
    anon_unknown_2::pseudoDtFromOptWithBoolSelType
              ((anon_unknown_2 *)this,(JsonObjVal *)attrs,&local_108,(PseudoDataLoc *)local_68,
               &local_110);
    std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>::
    ~unique_ptr(&local_110);
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              (&local_108);
  }
  else {
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::unique_ptr
              (&local_f0,in_RCX);
    std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>::
    unique_ptr(&local_f8,
               (unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
                *)local_a8);
    jsonSelFieldRanges_00 = JsonVal::asArray(local_c0);
    anon_unknown_2::pseudoDtFromOptWithIntSelType
              ((anon_unknown_2 *)this,(JsonObjVal *)attrs,&local_f0,(PseudoDataLoc *)local_68,
               &local_f8,jsonSelFieldRanges_00);
    std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>::
    ~unique_ptr(&local_f8);
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              (&local_f0);
  }
  local_fc = 1;
  std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>::
  ~unique_ptr((unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
               *)local_a8);
  PseudoDataLoc::~PseudoDataLoc((PseudoDataLoc *)local_68);
  return (__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
          )(__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
            )this;
}

Assistant:

PseudoDt::Up PseudoDtErector::_pseudoDtFromOptType(const JsonObjVal& jsonDt, MapItem::Up attrs)
{
    // selector location
    auto pseudoSelLoc = pseudoDataLocOfDynDt(jsonDt, strs::selFieldLoc);

    // data type
    auto pseudoDt = call([this, &jsonDt] {
        try {
            return this->pseudoDtOfJsonObj(jsonDt, strs::fc);
        } catch (TextParseError& exc) {
            appendMsgToTextParseError(exc, "In optional type:", jsonDt.loc());
            throw;
        }
    });

    // selector field ranges (presence indicates which kind of optional FC)
    if (const auto jsonSelFieldRanges = jsonDt[strs::selFieldRanges]) {
        return pseudoDtFromOptWithIntSelType(jsonDt, std::move(attrs), std::move(pseudoSelLoc),
                                             std::move(pseudoDt), jsonSelFieldRanges->asArray());
    } else {
        return pseudoDtFromOptWithBoolSelType(jsonDt, std::move(attrs),
                                              std::move(pseudoSelLoc), std::move(pseudoDt));
    }
}